

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.cpp
# Opt level: O2

void __thiscall libtorrent::dht::bootstrap::done(bootstrap *this)

{
  dht_observer *pdVar1;
  pointer psVar2;
  observer *this_00;
  node *this_01;
  shared_ptr<libtorrent::dht::observer> *o;
  pointer psVar3;
  endpoint local_44;
  
  pdVar1 = ((this->super_get_peers).super_find_data.super_traversal_algorithm.m_node)->m_observer;
  (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
            (pdVar1,4,"[%u] bootstrap done, pinging remaining nodes",
             (ulong)(this->super_get_peers).super_find_data.super_traversal_algorithm.m_id);
  psVar2 = (this->super_get_peers).super_find_data.super_traversal_algorithm.m_results.
           super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->super_get_peers).super_find_data.super_traversal_algorithm.m_results.
                super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar2; psVar3 = psVar3 + 1) {
    this_00 = (psVar3->super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    if (((this_00->flags).m_val & 1) == 0) {
      this_01 = (this->super_get_peers).super_find_data.super_traversal_algorithm.m_node;
      observer::target_ep(&local_44,this_00);
      dht::node::add_node(this_01,&local_44);
    }
  }
  find_data::done((find_data *)this);
  return;
}

Assistant:

void bootstrap::done()
{
#ifndef TORRENT_DISABLE_LOGGING
	get_node().observer()->log(dht_logger::traversal, "[%u] bootstrap done, pinging remaining nodes"
		, id());
#endif

	for (auto const& o : m_results)
	{
		if (o->flags & observer::flag_queried) continue;
		// this will send a ping
		m_node.add_node(o->target_ep());
	}
	get_peers::done();
}